

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void __thiscall BaseIndex::Stop(BaseIndex *this)

{
  long lVar1;
  bool bVar2;
  pointer pCVar3;
  thread *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                     ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                      in_RDI);
  (*pCVar3->_vptr_Chain[0x36])();
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
                     in_RDI);
  if (bVar2) {
    pCVar3 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_RDI);
    (*pCVar3->_vptr_Chain[0x36])();
    std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
              ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)in_RDI);
    ValidationSignals::UnregisterValidationInterface
              ((ValidationSignals *)in_RDI,(CValidationInterface *)0xf6fef8);
  }
  bVar2 = std::thread::joinable(in_RDI);
  if (bVar2) {
    std::thread::join();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BaseIndex::Stop()
{
    if (m_chain->context()->validation_signals) {
        m_chain->context()->validation_signals->UnregisterValidationInterface(this);
    }

    if (m_thread_sync.joinable()) {
        m_thread_sync.join();
    }
}